

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

hittable_list * final_scene(void)

{
  hittable_list *in_RDI;
  vec3 local_650;
  undefined4 local_634;
  undefined8 local_630;
  double local_628;
  undefined1 local_620 [16];
  undefined1 local_610 [32];
  shared_ptr<hittable> local_5f0;
  shared_ptr<lambertian> local_5dc;
  undefined1 local_5c0 [32];
  int local_5a0;
  int local_59c;
  int j_1;
  int ns;
  undefined1 local_580 [24];
  shared_ptr<lambertian> white;
  hittable_list boxes2;
  undefined1 local_52c [28];
  undefined1 local_510 [32];
  undefined8 local_4f0;
  undefined1 local_4e8 [8];
  shared_ptr<noise_texture> pertext;
  undefined1 local_4b8 [32];
  shared_ptr<image_texture> local_498;
  undefined1 local_488 [8];
  shared_ptr<lambertian> emat;
  stbi_uc *tex_data;
  int local_468;
  int nn;
  int ny;
  int nx;
  undefined1 local_448 [24];
  shared_ptr<constant_medium> local_430;
  shared_ptr<hittable> local_420;
  undefined8 local_410;
  shared_ptr<dielectric> local_408;
  undefined1 local_3f4 [28];
  undefined1 local_3d8 [40];
  undefined1 local_3b0 [24];
  shared_ptr<constant_medium> local_398;
  shared_ptr<hittable> local_388;
  shared_ptr<hittable> local_378;
  undefined8 local_368;
  shared_ptr<dielectric> local_360;
  undefined1 local_34c [28];
  undefined1 local_330 [8];
  shared_ptr<sphere> boundary;
  vec3 local_318;
  undefined1 local_300 [24];
  vec3 local_2e8;
  undefined1 local_2d0 [32];
  undefined8 local_2b0;
  shared_ptr<dielectric> local_2a8;
  undefined1 local_294 [28];
  undefined1 local_278 [36];
  undefined1 local_254 [12];
  undefined1 local_248 [32];
  vec3 local_228;
  undefined1 local_210 [24];
  shared_ptr<lambertian> moving_sphere_material;
  undefined1 local_1d8 [8];
  vec3 center2;
  vec3 center1;
  int local_1a0 [4];
  shared_ptr<xz_rect> local_190;
  shared_ptr<hittable> local_180;
  vec3 local_170;
  undefined1 local_158 [24];
  shared_ptr<diffuse_light> light;
  undefined1 local_130 [39];
  byte local_109;
  vec3 local_108;
  vec3 local_f0;
  undefined1 local_d8 [32];
  double local_b8;
  double z1;
  double y1;
  double x1;
  double y0;
  double z0;
  double x0;
  double w;
  int j;
  int i;
  int boxes_per_side;
  vec3 local_68;
  undefined1 local_50 [24];
  shared_ptr<lambertian> ground;
  hittable_list boxes1;
  hittable_list *objects;
  
  hittable_list::hittable_list
            ((hittable_list *)
             &ground.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  vec3::vec3(&local_68,0.48,0.83,0.53);
  std::make_shared<constant_texture,vec3>((vec3 *)local_50);
  std::make_shared<lambertian,std::shared_ptr<constant_texture>>
            ((shared_ptr<constant_texture> *)(local_50 + 0x10));
  std::shared_ptr<constant_texture>::~shared_ptr((shared_ptr<constant_texture> *)local_50);
  j = 0x14;
  for (w._4_4_ = 0; w._4_4_ < 0x14; w._4_4_ = w._4_4_ + 1) {
    for (w._0_4_ = 0; w._0_4_ < 0x14; w._0_4_ = w._0_4_ + 1) {
      x0 = 100.0;
      z0 = (double)w._4_4_ * 100.0 + -1000.0;
      y0 = (double)w._0_4_ * 100.0 + -1000.0;
      x1 = 0.0;
      y1 = z0 + 100.0;
      z1 = random_double(1.0,101.0);
      local_b8 = y0 + x0;
      vec3::vec3(&local_f0,z0,x1,y0);
      vec3::vec3(&local_108,y1,z1,local_b8);
      std::make_shared<box,vec3,vec3,std::shared_ptr<lambertian>&>
                ((vec3 *)local_d8,&local_f0,(shared_ptr<lambertian> *)&local_108);
      std::shared_ptr<hittable>::shared_ptr<box,void>
                ((shared_ptr<hittable> *)(local_d8 + 0x10),(shared_ptr<box> *)local_d8);
      hittable_list::add((hittable_list *)
                         &ground.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,(shared_ptr<hittable> *)(local_d8 + 0x10));
      std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_d8 + 0x10));
      std::shared_ptr<box>::~shared_ptr((shared_ptr<box> *)local_d8);
    }
  }
  local_109 = 0;
  hittable_list::hittable_list(in_RDI);
  light.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0;
  light.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 1;
  std::make_shared<bvh_node,hittable_list&,int,int>
            ((hittable_list *)local_130,
             (int *)&ground.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (int *)((long)&light.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4));
  std::shared_ptr<hittable>::shared_ptr<bvh_node,void>
            ((shared_ptr<hittable> *)(local_130 + 0x10),(shared_ptr<bvh_node> *)local_130);
  hittable_list::add(in_RDI,(shared_ptr<hittable> *)(local_130 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_130 + 0x10));
  std::shared_ptr<bvh_node>::~shared_ptr((shared_ptr<bvh_node> *)local_130);
  vec3::vec3(&local_170,7.0,7.0,7.0);
  std::make_shared<constant_texture,vec3>((vec3 *)local_158);
  std::make_shared<diffuse_light,std::shared_ptr<constant_texture>>
            ((shared_ptr<constant_texture> *)(local_158 + 0x10));
  std::shared_ptr<constant_texture>::~shared_ptr((shared_ptr<constant_texture> *)local_158);
  local_1a0[3] = 0x7b;
  local_1a0[2] = 0x1a7;
  local_1a0[1] = 0x93;
  local_1a0[0] = 0x19c;
  center1.e[2]._4_4_ = 0x22a;
  std::make_shared<xz_rect,int,int,int,int,int,std::shared_ptr<diffuse_light>&>
            ((int *)&local_190,local_1a0 + 3,local_1a0 + 2,local_1a0 + 1,local_1a0,
             (shared_ptr<diffuse_light> *)((long)center1.e + 0x14));
  std::shared_ptr<hittable>::shared_ptr<xz_rect,void>(&local_180,&local_190);
  hittable_list::add(in_RDI,&local_180);
  std::shared_ptr<hittable>::~shared_ptr(&local_180);
  std::shared_ptr<xz_rect>::~shared_ptr(&local_190);
  vec3::vec3((vec3 *)(center2.e + 2),400.0,400.0,200.0);
  vec3::vec3((vec3 *)&moving_sphere_material.
                      super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,30.0,
             0.0,0.0);
  operator+((vec3 *)local_1d8,(vec3 *)(center2.e + 2),
            (vec3 *)&moving_sphere_material.
                     super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  vec3::vec3(&local_228,0.7,0.3,0.1);
  std::make_shared<constant_texture,vec3>((vec3 *)local_210);
  std::make_shared<lambertian,std::shared_ptr<constant_texture>>
            ((shared_ptr<constant_texture> *)(local_210 + 0x10));
  std::shared_ptr<constant_texture>::~shared_ptr((shared_ptr<constant_texture> *)local_210);
  local_254._8_4_ = 0;
  local_254._4_4_ = 1;
  local_254._0_4_ = 0x32;
  std::make_shared<moving_sphere,vec3&,vec3&,int,int,int,std::shared_ptr<lambertian>&>
            ((vec3 *)local_248,(vec3 *)(center2.e + 2),(int *)local_1d8,(int *)(local_254 + 8),
             (int *)(local_254 + 4),(shared_ptr<lambertian> *)local_254);
  std::shared_ptr<hittable>::shared_ptr<moving_sphere,void>
            ((shared_ptr<hittable> *)(local_248 + 0x10),(shared_ptr<moving_sphere> *)local_248);
  hittable_list::add(in_RDI,(shared_ptr<hittable> *)(local_248 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_248 + 0x10));
  std::shared_ptr<moving_sphere>::~shared_ptr((shared_ptr<moving_sphere> *)local_248);
  vec3::vec3((vec3 *)(local_294 + 4),260.0,150.0,45.0);
  local_294._0_4_ = 0x32;
  local_2b0 = 0x3ff8000000000000;
  std::make_shared<dielectric,double>((double *)&local_2a8);
  std::make_shared<sphere,vec3,int,std::shared_ptr<dielectric>>
            ((vec3 *)local_278,(int *)(local_294 + 4),(shared_ptr<dielectric> *)local_294);
  std::shared_ptr<hittable>::shared_ptr<sphere,void>
            ((shared_ptr<hittable> *)(local_278 + 0x10),(shared_ptr<sphere> *)local_278);
  hittable_list::add(in_RDI,(shared_ptr<hittable> *)(local_278 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_278 + 0x10));
  std::shared_ptr<sphere>::~shared_ptr((shared_ptr<sphere> *)local_278);
  std::shared_ptr<dielectric>::~shared_ptr(&local_2a8);
  vec3::vec3(&local_2e8,0.0,150.0,145.0);
  local_300._20_4_ = 0x32;
  vec3::vec3(&local_318,0.8,0.8,0.9);
  boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4024000000000000;
  std::make_shared<metal,vec3,double>((vec3 *)local_300,local_318.e);
  std::make_shared<sphere,vec3,int,std::shared_ptr<metal>>
            ((vec3 *)local_2d0,(int *)&local_2e8,(shared_ptr<metal> *)(local_300 + 0x14));
  std::shared_ptr<hittable>::shared_ptr<sphere,void>
            ((shared_ptr<hittable> *)(local_2d0 + 0x10),(shared_ptr<sphere> *)local_2d0);
  hittable_list::add(in_RDI,(shared_ptr<hittable> *)(local_2d0 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_2d0 + 0x10));
  std::shared_ptr<sphere>::~shared_ptr((shared_ptr<sphere> *)local_2d0);
  std::shared_ptr<metal>::~shared_ptr((shared_ptr<metal> *)local_300);
  vec3::vec3((vec3 *)(local_34c + 4),360.0,150.0,145.0);
  local_34c._0_4_ = 0x46;
  local_368 = 0x3ff8000000000000;
  std::make_shared<dielectric,double>((double *)&local_360);
  std::make_shared<sphere,vec3,int,std::shared_ptr<dielectric>>
            ((vec3 *)local_330,(int *)(local_34c + 4),(shared_ptr<dielectric> *)local_34c);
  std::shared_ptr<dielectric>::~shared_ptr(&local_360);
  std::shared_ptr<hittable>::shared_ptr<sphere,void>(&local_378,(shared_ptr<sphere> *)local_330);
  hittable_list::add(in_RDI,&local_378);
  std::shared_ptr<hittable>::~shared_ptr(&local_378);
  local_3b0._16_8_ = 0.2;
  vec3::vec3((vec3 *)(local_3d8 + 0x10),0.2,0.4,0.9);
  std::make_shared<constant_texture,vec3>((vec3 *)local_3b0);
  std::
  make_shared<constant_medium,std::shared_ptr<sphere>&,double,std::shared_ptr<constant_texture>>
            ((shared_ptr<sphere> *)&local_398,(double *)local_330,
             (shared_ptr<constant_texture> *)(local_3b0 + 0x10));
  std::shared_ptr<hittable>::shared_ptr<constant_medium,void>(&local_388,&local_398);
  hittable_list::add(in_RDI,&local_388);
  std::shared_ptr<hittable>::~shared_ptr(&local_388);
  std::shared_ptr<constant_medium>::~shared_ptr(&local_398);
  std::shared_ptr<constant_texture>::~shared_ptr((shared_ptr<constant_texture> *)local_3b0);
  vec3::vec3((vec3 *)(local_3f4 + 4),0.0,0.0,0.0);
  local_3f4._0_4_ = 5000;
  local_410 = 0x3ff8000000000000;
  std::make_shared<dielectric,double>((double *)&local_408);
  std::make_shared<sphere,vec3,int,std::shared_ptr<dielectric>>
            ((vec3 *)local_3d8,(int *)(local_3f4 + 4),(shared_ptr<dielectric> *)local_3f4);
  std::shared_ptr<sphere>::operator=
            ((shared_ptr<sphere> *)local_330,(shared_ptr<sphere> *)local_3d8);
  std::shared_ptr<sphere>::~shared_ptr((shared_ptr<sphere> *)local_3d8);
  std::shared_ptr<dielectric>::~shared_ptr(&local_408);
  local_448._16_8_ = 0.0001;
  vec3::vec3((vec3 *)&ny,1.0,1.0,1.0);
  std::make_shared<constant_texture,vec3>((vec3 *)local_448);
  std::
  make_shared<constant_medium,std::shared_ptr<sphere>&,double,std::shared_ptr<constant_texture>>
            ((shared_ptr<sphere> *)&local_430,(double *)local_330,
             (shared_ptr<constant_texture> *)(local_448 + 0x10));
  std::shared_ptr<hittable>::shared_ptr<constant_medium,void>(&local_420,&local_430);
  hittable_list::add(in_RDI,&local_420);
  std::shared_ptr<hittable>::~shared_ptr(&local_420);
  std::shared_ptr<constant_medium>::~shared_ptr(&local_430);
  std::shared_ptr<constant_texture>::~shared_ptr((shared_ptr<constant_texture> *)local_448);
  emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       stbi_load("earthmap.jpg",&nn,&local_468,(int *)((long)&tex_data + 4),0);
  std::make_shared<image_texture,unsigned_char*&,int&,int&>
            ((uchar **)&local_498,
             (int *)&emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,&nn
            );
  std::make_shared<lambertian,std::shared_ptr<image_texture>>
            ((shared_ptr<image_texture> *)local_488);
  std::shared_ptr<image_texture>::~shared_ptr(&local_498);
  vec3::vec3((vec3 *)&stack0xfffffffffffffb30,400.0,200.0,400.0);
  pertext.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       100;
  std::make_shared<sphere,vec3,int,std::shared_ptr<lambertian>&>
            ((vec3 *)local_4b8,(int *)&stack0xfffffffffffffb30,
             (shared_ptr<lambertian> *)
             ((long)&pertext.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 4));
  std::shared_ptr<hittable>::shared_ptr<sphere,void>
            ((shared_ptr<hittable> *)(local_4b8 + 0x10),(shared_ptr<sphere> *)local_4b8);
  hittable_list::add(in_RDI,(shared_ptr<hittable> *)(local_4b8 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_4b8 + 0x10));
  std::shared_ptr<sphere>::~shared_ptr((shared_ptr<sphere> *)local_4b8);
  local_4f0 = 0x3fb999999999999a;
  std::make_shared<noise_texture,double>((double *)local_4e8);
  vec3::vec3((vec3 *)(local_52c + 4),220.0,280.0,300.0);
  local_52c._0_4_ = 0x50;
  std::make_shared<lambertian,std::shared_ptr<noise_texture>&>
            ((shared_ptr<noise_texture> *)
             &boxes2.objects.
              super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::make_shared<sphere,vec3,int,std::shared_ptr<lambertian>>
            ((vec3 *)local_510,(int *)(local_52c + 4),(shared_ptr<lambertian> *)local_52c);
  std::shared_ptr<hittable>::shared_ptr<sphere,void>
            ((shared_ptr<hittable> *)(local_510 + 0x10),(shared_ptr<sphere> *)local_510);
  hittable_list::add(in_RDI,(shared_ptr<hittable> *)(local_510 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_510 + 0x10));
  std::shared_ptr<sphere>::~shared_ptr((shared_ptr<sphere> *)local_510);
  std::shared_ptr<lambertian>::~shared_ptr
            ((shared_ptr<lambertian> *)
             &boxes2.objects.
              super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  hittable_list::hittable_list
            ((hittable_list *)
             &white.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  vec3::vec3((vec3 *)&j_1,0.73,0.73,0.73);
  std::make_shared<constant_texture,vec3>((vec3 *)local_580);
  std::make_shared<lambertian,std::shared_ptr<constant_texture>>
            ((shared_ptr<constant_texture> *)(local_580 + 0x10));
  std::shared_ptr<constant_texture>::~shared_ptr((shared_ptr<constant_texture> *)local_580);
  local_59c = 1000;
  for (local_5a0 = 0; local_5a0 < local_59c; local_5a0 = local_5a0 + 1) {
    vec3::random();
    local_5dc.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 10;
    std::make_shared<sphere,vec3,int,std::shared_ptr<lambertian>&>
              ((vec3 *)local_5c0,
               (int *)((long)&local_5dc.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 4),&local_5dc);
    std::shared_ptr<hittable>::shared_ptr<sphere,void>
              ((shared_ptr<hittable> *)(local_5c0 + 0x10),(shared_ptr<sphere> *)local_5c0);
    hittable_list::add((hittable_list *)
                       &white.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ,(shared_ptr<hittable> *)(local_5c0 + 0x10));
    std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_5c0 + 0x10));
    std::shared_ptr<sphere>::~shared_ptr((shared_ptr<sphere> *)local_5c0);
  }
  local_628 = 0.0;
  local_630 = 0x3ff0000000000000;
  std::make_shared<bvh_node,hittable_list&,double,double>
            ((hittable_list *)local_620,
             (double *)&white.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,&local_628);
  local_634 = 0xf;
  std::make_shared<rotate_y,std::shared_ptr<bvh_node>,int>
            ((shared_ptr<bvh_node> *)local_610,(int *)local_620);
  vec3::vec3(&local_650,-100.0,270.0,395.0);
  std::make_shared<translate,std::shared_ptr<rotate_y>,vec3>
            ((shared_ptr<rotate_y> *)(local_610 + 0x10),(vec3 *)local_610);
  std::shared_ptr<hittable>::shared_ptr<translate,void>
            (&local_5f0,(shared_ptr<translate> *)(local_610 + 0x10));
  hittable_list::add(in_RDI,&local_5f0);
  std::shared_ptr<hittable>::~shared_ptr(&local_5f0);
  std::shared_ptr<translate>::~shared_ptr((shared_ptr<translate> *)(local_610 + 0x10));
  std::shared_ptr<rotate_y>::~shared_ptr((shared_ptr<rotate_y> *)local_610);
  std::shared_ptr<bvh_node>::~shared_ptr((shared_ptr<bvh_node> *)local_620);
  local_109 = 1;
  std::shared_ptr<lambertian>::~shared_ptr((shared_ptr<lambertian> *)(local_580 + 0x10));
  hittable_list::~hittable_list
            ((hittable_list *)
             &white.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<noise_texture>::~shared_ptr((shared_ptr<noise_texture> *)local_4e8);
  std::shared_ptr<lambertian>::~shared_ptr((shared_ptr<lambertian> *)local_488);
  std::shared_ptr<sphere>::~shared_ptr((shared_ptr<sphere> *)local_330);
  std::shared_ptr<lambertian>::~shared_ptr((shared_ptr<lambertian> *)(local_210 + 0x10));
  std::shared_ptr<diffuse_light>::~shared_ptr((shared_ptr<diffuse_light> *)(local_158 + 0x10));
  if ((local_109 & 1) == 0) {
    hittable_list::~hittable_list(in_RDI);
  }
  std::shared_ptr<lambertian>::~shared_ptr((shared_ptr<lambertian> *)(local_50 + 0x10));
  hittable_list::~hittable_list
            ((hittable_list *)
             &ground.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return in_RDI;
}

Assistant:

hittable_list final_scene() {
    hittable_list boxes1;
    auto ground =
            make_shared<lambertian>(make_shared<constant_texture>(vec3(0.48, 0.83, 0.53)));

    const int boxes_per_side = 20;
    for (int i = 0; i < boxes_per_side; i++) {
        for (int j = 0; j < boxes_per_side; j++) {
            auto w = 100.0;
            auto x0 = -1000.0 + i*w;
            auto z0 = -1000.0 + j*w;
            auto y0 = 0.0;
            auto x1 = x0 + w;
            auto y1 = random_double(1,101);
            auto z1 = z0 + w;

            boxes1.add(make_shared<box>(vec3(x0,y0,z0), vec3(x1,y1,z1), ground));
        }
    }

    hittable_list objects;

    objects.add(make_shared<bvh_node>(boxes1, 0, 1));

    auto light = make_shared<diffuse_light>(make_shared<constant_texture>(vec3(7, 7, 7)));
    objects.add(make_shared<xz_rect>(123, 423, 147, 412, 554, light));

    auto center1 = vec3(400, 400, 200);
    auto center2 = center1 + vec3(30,0,0);
    auto moving_sphere_material =
            make_shared<lambertian>(make_shared<constant_texture>(vec3(0.7, 0.3, 0.1)));
    objects.add(make_shared<moving_sphere>(center1, center2, 0, 1, 50, moving_sphere_material));

    objects.add(make_shared<sphere>(vec3(260, 150, 45), 50, make_shared<dielectric>(1.5)));
    objects.add(make_shared<sphere>(
            vec3(0, 150, 145), 50, make_shared<metal>(vec3(0.8, 0.8, 0.9), 10.0)
    ));

    auto boundary = make_shared<sphere>(vec3(360, 150, 145), 70, make_shared<dielectric>(1.5));
    objects.add(boundary);
    objects.add(make_shared<constant_medium>(
            boundary, 0.2, make_shared<constant_texture>(vec3(0.2, 0.4, 0.9))
    ));
    boundary = make_shared<sphere>(vec3(0, 0, 0), 5000, make_shared<dielectric>(1.5));
    objects.add(make_shared<constant_medium>(
            boundary, .0001, make_shared<constant_texture>(vec3(1,1,1))));

    int nx, ny, nn;
    auto tex_data = stbi_load("earthmap.jpg", &nx, &ny, &nn, 0);
    auto emat = make_shared<lambertian>(make_shared<image_texture>(tex_data, nx, ny));
    objects.add(make_shared<sphere>(vec3(400,200, 400), 100, emat));
    auto pertext = make_shared<noise_texture>(0.1);
    objects.add(make_shared<sphere>(vec3(220,280, 300), 80, make_shared<lambertian>(pertext)));

    hittable_list boxes2;
    auto white = make_shared<lambertian>(make_shared<constant_texture>(vec3(0.73, 0.73, 0.73)));
    int ns = 1000;
    for (int j = 0; j < ns; j++) {
        boxes2.add(make_shared<sphere>(vec3::random(0,165), 10, white));
    }

    objects.add(make_shared<translate>(
            make_shared<rotate_y>(
                    make_shared<bvh_node>(boxes2, 0.0, 1.0), 15),
            vec3(-100,270,395)
                )
    );

    return objects;
}